

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_downward.h
# Opt level: O2

void __thiscall
flatbuffers::vector_downward<unsigned_int>::clear_allocator(vector_downward<unsigned_int> *this)

{
  if ((this->own_allocator_ == true) && (this->allocator_ != (Allocator *)0x0)) {
    (*this->allocator_->_vptr_Allocator[1])();
  }
  this->allocator_ = (Allocator *)0x0;
  this->own_allocator_ = false;
  return;
}

Assistant:

void clear_allocator() {
    if (own_allocator_ && allocator_) { delete allocator_; }
    allocator_ = nullptr;
    own_allocator_ = false;
  }